

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

bool Catch::TestCaseTracking::operator==(NameAndLocation *lhs,NameAndLocationRef *rhs)

{
  bool bVar1;
  StringRef local_20;
  
  if ((lhs->location).line == (rhs->location).line) {
    local_20.m_start = (lhs->name)._M_dataplus._M_p;
    local_20.m_size = (lhs->name)._M_string_length;
    bVar1 = StringRef::operator==(&local_20,rhs->name);
    if (bVar1) {
      bVar1 = SourceLineInfo::operator==(&lhs->location,&rhs->location);
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==( NameAndLocation const& lhs,
                                NameAndLocationRef const& rhs ) {
            // This is a very cheap check that should have a very high hit rate.
            // If we get to SourceLineInfo::operator==, we will redo it, but the
            // cost of repeating is trivial at that point (we will be paying
            // multiple strcmp/memcmps at that point).
            if ( lhs.location.line != rhs.location.line ) { return false; }
            return StringRef( lhs.name ) == rhs.name &&
                   lhs.location == rhs.location;
        }